

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O0

string * __thiscall
cmTimestamp::AddTimestampComponent_abi_cxx11_
          (string *__return_storage_ptr__,cmTimestamp *this,char flag,tm *timeStruct,time_t timeT)

{
  double dVar1;
  char *__format;
  size_t sVar2;
  allocator local_271;
  size_t local_270;
  size_t size;
  char buffer [16];
  ostringstream local_250 [8];
  ostringstream ss;
  allocator<char> local_d1;
  string local_d0;
  time_t local_b0;
  time_t unixEpoch;
  tm tmUnixEpoch;
  allocator<char> local_51;
  string local_50 [8];
  string formatString;
  time_t timeT_local;
  tm *timeStruct_local;
  char flag_local;
  cmTimestamp *this_local;
  
  formatString.field_2._8_8_ = timeT;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"%",&local_51);
  std::allocator<char>::~allocator(&local_51);
  std::__cxx11::string::operator+=(local_50,flag);
  switch(flag) {
  case '%':
  case 'A':
  case 'B':
  case 'H':
  case 'I':
  case 'M':
  case 'S':
  case 'U':
  case 'Y':
  case 'a':
  case 'b':
  case 'd':
  case 'j':
  case 'm':
  case 'w':
  case 'y':
    __format = (char *)std::__cxx11::string::c_str();
    sVar2 = strftime((char *)&size,0x10,__format,(tm *)timeStruct);
    local_270 = sVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)&size,sVar2,&local_271);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    break;
  default:
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_50);
    break;
  case 's':
    tmUnixEpoch.tm_wday = 0;
    tmUnixEpoch.tm_yday = 0;
    tmUnixEpoch.tm_isdst = 0;
    tmUnixEpoch._36_4_ = 0;
    tmUnixEpoch.tm_mon = 0;
    tmUnixEpoch.tm_year = 0;
    unixEpoch = 0;
    tmUnixEpoch.tm_gmtoff = 0;
    tmUnixEpoch.tm_sec = 0;
    tmUnixEpoch.tm_min = 1;
    tmUnixEpoch.tm_hour = 0;
    tmUnixEpoch.tm_mday = 0x46;
    local_b0 = CreateUtcTimeTFromTm(this,(tm *)&unixEpoch);
    if (local_b0 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,
                 "Error generating UNIX epoch in STRING(TIMESTAMP ...). Please, file a bug report against CMake"
                 ,&local_d1);
      cmSystemTools::Error(&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator(&local_d1);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_250);
      dVar1 = difftime(formatString.field_2._8_8_,local_b0);
      std::ostream::operator<<(local_250,(long)dVar1);
      std::__cxx11::ostringstream::str();
      std::__cxx11::ostringstream::~ostringstream(local_250);
    }
  }
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::AddTimestampComponent(char flag,
                                               struct tm& timeStruct,
                                               const time_t timeT) const
{
  std::string formatString = "%";
  formatString += flag;

  switch (flag) {
    case 'a':
    case 'A':
    case 'b':
    case 'B':
    case 'd':
    case 'H':
    case 'I':
    case 'j':
    case 'm':
    case 'M':
    case 'S':
    case 'U':
    case 'w':
    case 'y':
    case 'Y':
    case '%':
      break;
    case 's': // Seconds since UNIX epoch (midnight 1-jan-1970)
    {
      // Build a time_t for UNIX epoch and substract from the input "timeT":
      struct tm tmUnixEpoch;
      memset(&tmUnixEpoch, 0, sizeof(tmUnixEpoch));
      tmUnixEpoch.tm_mday = 1;
      tmUnixEpoch.tm_year = 1970 - 1900;

      const time_t unixEpoch = this->CreateUtcTimeTFromTm(tmUnixEpoch);
      if (unixEpoch == -1) {
        cmSystemTools::Error(
          "Error generating UNIX epoch in "
          "STRING(TIMESTAMP ...). Please, file a bug report against CMake");
        return std::string();
      }

      std::ostringstream ss;
      ss << static_cast<long int>(difftime(timeT, unixEpoch));
      return ss.str();
    }
    default: {
      return formatString;
    }
  }

  char buffer[16];

  size_t size =
    strftime(buffer, sizeof(buffer), formatString.c_str(), &timeStruct);

  return std::string(buffer, size);
}